

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O2

Matrix6x6 * __thiscall
iDynTree::ArticulatedBodyInertia::getInverse
          (Matrix6x6 *__return_storage_ptr__,ArticulatedBodyInertia *this)

{
  Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  local_198;
  Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> local_188;
  Matrix<double,_6,_6,_0,_6,_6> abi;
  
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_outerStride = 6;
  local_198.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)this;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_0>.m_data =
       (PointerType)&abi;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_xpr = &abi;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            (&local_188,&local_198.m_matrix);
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_0>.m_data =
       abi.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array +
       0x12;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_outerStride = 6;
  local_198.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (this->linearAngular).m_data;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_xpr = &abi;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            (&local_188,&local_198.m_matrix);
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_0>.m_data =
       abi.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 3;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startRow.m_value
       = 3;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_outerStride = 6;
  local_198.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (this->linearAngular).m_data;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_xpr = &abi;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>>
            (&local_188,&local_198);
  local_198.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (this->angularAngular).m_data;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_0>.m_data =
       abi.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array +
       0x15;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startRow.m_value
       = 3;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_outerStride = 6;
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_xpr = &abi;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            (&local_188,&local_198.m_matrix);
  local_188.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_0>.m_data =
       __return_storage_ptr__->m_data;
  Eigen::internal::
  compute_inverse<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_6>
  ::run(&abi,(Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)&local_188);
  return __return_storage_ptr__;
}

Assistant:

Matrix6x6 ArticulatedBodyInertia::getInverse() const
{
    Matrix6x6 ret;

    Eigen::Matrix<double,6,6> abi;

    abi.block<3,3>(0,0) = toEigen(linearLinear);
    abi.block<3,3>(0,3) = toEigen(linearAngular);
    abi.block<3,3>(3,0) = toEigen(linearAngular).transpose();
    abi.block<3,3>(3,3) = toEigen(angularAngular);

    toEigen(ret) = abi.inverse();

    return ret;
}